

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,StringTree *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,String *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,ArrayPtr<const_char> *params_12,StringTree *params_13,
          ArrayPtr<const_char> *params_14)

{
  ArrayPtr<const_char> *rest_3;
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_e8;
  StringTree *local_d0;
  StringTree *local_c8;
  ArrayPtr<const_char> *local_c0;
  ArrayPtr<const_char> *local_b8;
  ArrayPtr<const_char> *local_b0;
  size_t local_a8;
  char *local_a0;
  size_t sStack_98;
  size_t local_90;
  size_t sStack_88;
  size_t local_80;
  char *local_78;
  char *local_70;
  size_t sStack_68;
  long local_60;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_a8 = this->size_;
  local_a0 = (params->text).content.ptr;
  sStack_98 = params_1->size_;
  local_90 = params_2->size_;
  sStack_88 = params_3->size_;
  local_80 = params_4->size_;
  local_78 = params_5->ptr;
  local_70 = (params_6->text).content.ptr;
  sStack_68 = params_7->size_;
  local_60 = 0;
  if (params_8->size_ != 0) {
    local_60 = params_8->size_ - 1;
  }
  local_58 = (params_9->content).size_;
  sStack_50 = params_10->size_;
  local_48 = params_11->size_;
  local_40 = params_12->ptr;
  local_38 = (params_13->text).content.ptr;
  nums._M_len = (size_type)params_10;
  nums._M_array = (iterator)0xf;
  local_d0 = this;
  local_b0 = params_3;
  sVar1 = _::sum((_ *)&local_a8,nums);
  rest_3 = local_b0;
  __return_storage_ptr__->size_ = sVar1;
  local_a8 = 0;
  local_a0 = (params->text).content.ptr;
  sStack_98 = params_1->size_;
  local_90 = params_2->size_;
  sStack_88 = local_b0->size_;
  local_80 = params_4->size_;
  local_78 = (char *)0x0;
  local_70 = (params_6->text).content.ptr;
  sStack_68 = params_7->size_;
  local_60 = 0;
  local_58 = (params_9->content).size_;
  sStack_50 = params_10->size_;
  local_48 = params_11->size_;
  local_40 = (char *)0x0;
  local_38 = (params_13->text).content.ptr;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0xf;
  local_c8 = params;
  local_c0 = params_1;
  local_b8 = params_2;
  sVar1 = _::sum((_ *)&local_a8,nums_00);
  heapString((String *)&local_e8,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_e8);
  Array<char>::~Array((Array<char> *)&local_e8);
  local_a8 = 1;
  local_a0 = (char *)0x0;
  sStack_98 = 0;
  local_80 = 0;
  local_90 = 0;
  sStack_88 = 0;
  local_78 = (char *)0x1;
  local_70 = (char *)0x0;
  sStack_68 = 0;
  local_60 = 1;
  local_58 = 0;
  sStack_50 = 0;
  local_48 = 0;
  local_40 = (char *)0x1;
  local_38 = (char *)0x0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0xf;
  sVar1 = _::sum((_ *)&local_a8,nums_01);
  local_e8.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_e8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_e8.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_e8);
  Array<kj::StringTree::Branch>::~Array(&local_e8);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_d0,(ArrayPtr<const_char> *)local_c8,local_c0,
             local_b8,rest_3,params_4,(StringTree *)params_5,(ArrayPtr<const_char> *)params_6,
             params_7,(String *)params_8,(ArrayPtr<const_char> *)params_9,params_10,params_11,
             (StringTree *)params_12,(ArrayPtr<const_char> *)params_13);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}